

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

bool ON_SubDEdgeSharpness::EqualTrend(ON_SubDEdgeSharpness s0,ON_SubDEdgeSharpness s1)

{
  int iVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  fVar5 = s1.m_edge_sharpness[0];
  fVar6 = s1.m_edge_sharpness[1];
  fVar3 = s0.m_edge_sharpness[0];
  fVar4 = s0.m_edge_sharpness[1];
  if ((fVar4 == fVar5) && (!NAN(fVar4) && !NAN(fVar5))) {
    iVar1 = 1;
    iVar2 = iVar1;
    if (fVar4 <= fVar3) {
      if (fVar3 <= fVar4) {
        iVar2 = -0x7fffffff;
        if (fVar3 == fVar4) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = -1;
      }
    }
    if (fVar6 <= fVar5) {
      if (fVar5 <= fVar6) {
        iVar1 = -0x7fffffff;
        if (fVar5 == fVar6) {
          iVar1 = 0;
        }
      }
      else {
        iVar1 = -1;
      }
    }
    return iVar2 == iVar1;
  }
  return false;
}

Assistant:

bool ON_SubDEdgeSharpness::EqualTrend(
  ON_SubDEdgeSharpness s0,
  ON_SubDEdgeSharpness s1
)
{
  if (false == (s0.m_edge_sharpness[1] == s1.m_edge_sharpness[0]))
    return false;
  return (s0.Trend() == s1.Trend());
}